

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::DoParseJson(Parser *this)

{
  _Base_ptr p_Var1;
  CheckedError *ce;
  StructDef *in_RSI;
  uoffset_t toff;
  size_type __dnew;
  long *local_40;
  long local_38;
  long local_30 [2];
  long local_20;
  
  if (*(int *)((long)&(in_RSI->super_Definition).name.field_2 + 0xc) == 0x7b) {
    p_Var1 = *(_Base_ptr *)
              ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    if (p_Var1 == (_Base_ptr)0x0) {
      local_40 = local_30;
      local_20 = 0x23;
      local_40 = (long *)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_20);
      local_30[0] = local_20;
      local_40[2] = 0x73726170206f7420;
      local_40[3] = 0x77206e6f736a2065;
      *local_40 = 0x20746f6f72206f6e;
      local_40[1] = 0x7465732065707974;
      builtin_strncpy((char *)((long)local_40 + 0x1f),"with",4);
      local_38 = local_20;
      *(char *)((long)local_40 + local_20) = '\0';
      Error(this,(string *)in_RSI);
    }
    else {
      if (in_RSI[1].super_Definition.serialized_location == 0) {
        ParseTable(this,in_RSI,(string *)p_Var1,(uoffset_t *)0x0);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012d580;
        p_Var1 = *(_Base_ptr *)
                  ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.
                          super__Rb_tree_header._M_header + 0x18);
        if (p_Var1 != (_Base_ptr)0x0) {
          p_Var1 = *(_Base_ptr *)
                    ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_header + 0x10);
        }
        FlatBufferBuilderImpl<false>::Finish
                  ((FlatBufferBuilderImpl<false> *)
                   &in_RSI[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,(uoffset_t)local_40,(char *)p_Var1,
                   *(bool *)((long)&in_RSI[4].super_Definition.file._M_string_length + 1));
        goto LAB_0012d4de;
      }
      local_40 = local_30;
      local_20 = 0x2f;
      local_40 = (long *)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_20);
      local_30[0] = local_20;
      builtin_strncpy((char *)((long)local_40 + 0x1f),"object i",8);
      builtin_strncpy((char *)((long)local_40 + 0x27),"n a file",8);
      local_40[2] = 0x6e6f206e61687420;
      local_40[3] = 0x6f206e6f736a2065;
      *local_40 = 0x6820746f6e6e6163;
      local_40[1] = 0x65726f6d20657661;
      local_38 = local_20;
      *(char *)((long)local_40 + local_20) = '\0';
      Error(this,(string *)in_RSI);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  else {
    Expect(this,(int)in_RSI);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012d580;
LAB_0012d4de:
    if (*(char *)&in_RSI[4].original_location._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl == '\x01') {
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0012d580;
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0012d580:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParseJson() {
  if (token_ != '{') {
    EXPECT('{');
  } else {
    if (!root_struct_def_) return Error("no root type set to parse json with");
    if (builder_.GetSize()) {
      return Error("cannot have more than one json object in a file");
    }
    uoffset_t toff;
    ECHECK(ParseTable(*root_struct_def_, nullptr, &toff));
    if (opts.size_prefixed) {
      builder_.FinishSizePrefixed(
          Offset<Table>(toff),
          file_identifier_.length() ? file_identifier_.c_str() : nullptr);
    } else {
      builder_.Finish(Offset<Table>(toff), file_identifier_.length()
                                               ? file_identifier_.c_str()
                                               : nullptr);
    }
  }
  if (opts.require_json_eof) {
    // Check that JSON file doesn't contain more objects or IDL directives.
    // Comments after JSON are allowed.
    EXPECT(kTokenEof);
  }
  return NoError();
}